

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_Bother(void)

{
  Task *in_RDI;
  undefined1 local_ae8 [8];
  Task wait;
  string local_768;
  undefined1 local_748 [8];
  Task bother;
  Task bark;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Task *botherGroup;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bother",&local_39);
  Task::Task(in_RDI,&local_38,Compound);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back(&(in_RDI->preconditions).satisfiedPredicates,
            (value_type *)
            ((long)&bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + 4));
  create_Bark((Task *)&bother.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,Bother);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"bother",
             (allocator<char> *)
             ((long)&wait.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  Task::Task((Task *)local_748,&local_768,Simple);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&wait.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  bother.modifiedVectors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 7;
  create_Wait((Task *)local_ae8,3.0);
  Task::addSubtask(in_RDI,(Task *)&bother.parameters.flags.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_end_of_storage);
  Task::addSubtask(in_RDI,(Task *)local_748);
  Task::addSubtask(in_RDI,(Task *)local_ae8);
  local_11 = 1;
  Task::~Task((Task *)local_ae8);
  Task::~Task((Task *)local_748);
  Task::~Task((Task *)&bother.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
  if ((local_11 & 1) == 0) {
    Task::~Task(in_RDI);
  }
  return in_RDI;
}

Assistant:

Task create_Bother()
	{
		Task botherGroup {"bother", TaskType::Compound};
		botherGroup.preconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		auto bark = create_Bark(Bark::Bother);

		Task bother {"bother"};
		bother.action = Action::BotherPlayer;		
		
		auto wait = create_Wait(3);

		botherGroup.addSubtask(bark);
		botherGroup.addSubtask(bother);
		botherGroup.addSubtask(wait);

		return botherGroup;
	}